

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLURL::XMLURL(XMLURL *this,XMLCh *baseURL,XMLCh *relativeURL,MemoryManager *manager)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_40 [8];
  CleanupType_conflict6 cleanup;
  MemoryManager *manager_local;
  XMLCh *relativeURL_local;
  XMLCh *baseURL_local;
  XMLURL *this_local;
  
  cleanup._16_8_ = manager;
  XMemory::XMemory((XMemory *)this);
  this->_vptr_XMLURL = (_func_int **)&PTR__XMLURL_00526c98;
  this->fMemoryManager = (MemoryManager *)cleanup._16_8_;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fPortNum = 0;
  this->fProtocol = Unknown;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  this->fURLText = (XMLCh *)0x0;
  this->fHasInvalidChar = false;
  JanitorMemFunCall<xercesc_4_0::XMLURL>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLURL> *)local_40,this,(MFPT)cleanUp);
  setURL(this,baseURL,relativeURL);
  JanitorMemFunCall<xercesc_4_0::XMLURL>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLURL> *)local_40);
  JanitorMemFunCall<xercesc_4_0::XMLURL>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLURL> *)local_40);
  return;
}

Assistant:

XMLURL::XMLURL(const XMLCh* const    baseURL
             , const XMLCh* const    relativeURL
             , MemoryManager* const manager) :

    fMemoryManager(manager)
    , fFragment(0)
    , fHost(0)
    , fPassword(0)
    , fPath(0)
    , fPortNum(0)
    , fProtocol(XMLURL::Unknown)
    , fQuery(0)
    , fUser(0)
    , fURLText(0)
    , fHasInvalidChar(false)
{
    CleanupType cleanup(this, &XMLURL::cleanUp);

	try
	{
        setURL(baseURL, relativeURL);
	}
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}